

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::BufferIoExecutor
          (BufferIoExecutor *this,Context *context,ShaderSpec *shaderSpec)

{
  ShaderSpec *shaderSpec_local;
  Context *context_local;
  BufferIoExecutor *this_local;
  
  ShaderExecutor::ShaderExecutor(&this->super_ShaderExecutor,context,shaderSpec);
  (this->super_ShaderExecutor)._vptr_ShaderExecutor = (_func_int **)&PTR__BufferIoExecutor_016721b0;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_inputBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_outputBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_inputAlloc);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_outputAlloc);
  std::
  vector<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ::vector(&this->m_inputLayout);
  std::
  vector<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ::vector(&this->m_outputLayout);
  computeVarLayout(&(this->super_ShaderExecutor).m_shaderSpec.inputs,&this->m_inputLayout);
  computeVarLayout(&(this->super_ShaderExecutor).m_shaderSpec.outputs,&this->m_outputLayout);
  return;
}

Assistant:

BufferIoExecutor::BufferIoExecutor (Context& context, const ShaderSpec& shaderSpec)
	: ShaderExecutor(context, shaderSpec)
{
	computeVarLayout(m_shaderSpec.inputs, &m_inputLayout);
	computeVarLayout(m_shaderSpec.outputs, &m_outputLayout);
}